

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O2

TimeStamp __thiscall RealDiskInterface::Stat(RealDiskInterface *this,string *path,string *err)

{
  Metrics *this_00;
  int iVar1;
  int *piVar2;
  char *__rhs;
  Metric *pMVar3;
  TimeStamp TStack_130;
  ScopedMetric metrics_h_scoped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  stat st;
  
  if ((Stat(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Stat(std::__cxx11::string_const&,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar1 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar3 = (Metric *)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&st,"node stat",(allocator<char> *)&local_d0);
      pMVar3 = Metrics::NewMetric(this_00,(string *)&st);
      std::__cxx11::string::~string((string *)&st);
    }
    Stat::metrics_h_metric = pMVar3;
    __cxa_guard_release(&Stat(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,Stat::metrics_h_metric);
  iVar1 = stat((path->_M_dataplus)._M_p,(stat *)&st);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    TStack_130 = 0;
    if ((*piVar2 != 2) && (*piVar2 != 0x14)) {
      std::operator+(&local_110,"stat(",path);
      std::operator+(&local_f0,&local_110,"): ");
      __rhs = strerror(*piVar2);
      std::operator+(&local_d0,&local_f0,__rhs);
      std::__cxx11::string::operator=((string *)err,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      TStack_130 = -1;
    }
  }
  else if (st.st_mtim.tv_sec == 0) {
    TStack_130 = 1;
  }
  else {
    TStack_130 = st.st_mtim.tv_sec * 1000000000 + st.st_mtim.tv_nsec;
  }
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return TStack_130;
}

Assistant:

TimeStamp RealDiskInterface::Stat(const string& path, string* err) const {
  METRIC_RECORD("node stat");
#ifdef _WIN32
  // MSDN: "Naming Files, Paths, and Namespaces"
  // http://msdn.microsoft.com/en-us/library/windows/desktop/aa365247(v=vs.85).aspx
  if (!path.empty() && path[0] != '\\' && path.size() > MAX_PATH) {
    ostringstream err_stream;
    err_stream << "Stat(" << path << "): Filename longer than " << MAX_PATH
               << " characters";
    *err = err_stream.str();
    return -1;
  }
  if (!use_cache_)
    return StatSingleFile(path, err);

  string dir = DirName(path);
  string base(path.substr(dir.size() ? dir.size() + 1 : 0));
  if (base == "..") {
    // StatAllFilesInDir does not report any information for base = "..".
    base = ".";
    dir = path;
  }

  transform(dir.begin(), dir.end(), dir.begin(), ::tolower);
  transform(base.begin(), base.end(), base.begin(), ::tolower);

  Cache::iterator ci = cache_.find(dir);
  if (ci == cache_.end()) {
    ci = cache_.insert(make_pair(dir, DirCache())).first;
    if (!StatAllFilesInDir(dir.empty() ? "." : dir, &ci->second, err)) {
      cache_.erase(ci);
      return -1;
    }
  }
  DirCache::iterator di = ci->second.find(base);
  return di != ci->second.end() ? di->second : 0;
#else
  struct stat st;
  if (stat(path.c_str(), &st) < 0) {
    if (errno == ENOENT || errno == ENOTDIR)
      return 0;
    *err = "stat(" + path + "): " + strerror(errno);
    return -1;
  }
  // Some users (Flatpak) set mtime to 0, this should be harmless
  // and avoids conflicting with our return value of 0 meaning
  // that it doesn't exist.
  if (st.st_mtime == 0)
    return 1;
#if defined(_AIX)
  return (int64_t)st.st_mtime * 1000000000LL + st.st_mtime_n;
#elif defined(__APPLE__)
  return ((int64_t)st.st_mtimespec.tv_sec * 1000000000LL +
          st.st_mtimespec.tv_nsec);
#elif defined(st_mtime) // A macro, so we're likely on modern POSIX.
  return (int64_t)st.st_mtim.tv_sec * 1000000000LL + st.st_mtim.tv_nsec;
#else
  return (int64_t)st.st_mtime * 1000000000LL + st.st_mtimensec;
#endif
#endif
}